

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t pax_attribute_LIBARCHIVE_xattr
                  (archive_entry *entry,char *name,size_t name_length,char *value,
                  size_t value_length)

{
  byte bVar1;
  byte *pbVar2;
  byte *name_00;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  size_t size;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  wchar_t wVar10;
  bool bVar11;
  
  name_00 = (byte *)malloc(name_length + 1);
  if (name_00 == (byte *)0x0) {
    name_00 = (byte *)0x0;
  }
  else {
    pbVar3 = name_00;
    if (name_length != 0) {
      do {
        if (*name == 0) break;
        if ((name_length < 3) || (*name != 0x25)) {
LAB_0014d203:
          bVar1 = *name;
          name = (char *)((byte *)name + 1);
          *pbVar3 = bVar1;
          pbVar3 = pbVar3 + 1;
          name_length = name_length - 1;
        }
        else {
          iVar6 = (int)(char)((byte *)name)[1];
          uVar7 = iVar6 - 0x30;
          if (9 < uVar7) {
            if (iVar6 - 0x41U < 6) {
              uVar7 = iVar6 - 0x37;
            }
            else {
              uVar7 = iVar6 - 0x57;
              if (5 < iVar6 - 0x61U) {
                uVar7 = 0xffffffff;
              }
            }
          }
          iVar6 = (int)(char)((byte *)name)[2];
          uVar8 = iVar6 - 0x30;
          if (9 < uVar8) {
            if (iVar6 - 0x41U < 6) {
              uVar8 = iVar6 - 0x37;
            }
            else {
              uVar8 = iVar6 - 0x57;
              if (5 < iVar6 - 0x61U) {
                uVar8 = 0xffffffff;
              }
            }
          }
          if (-1 < (int)(uVar7 | uVar8)) {
            name = (char *)((byte *)name + 3);
            name_length = name_length - 3;
            *pbVar3 = (byte)uVar8 | (byte)(uVar7 << 4);
            pbVar3 = pbVar3 + 1;
          }
          if ((int)(uVar7 | uVar8) < 0) goto LAB_0014d203;
        }
      } while (name_length != 0);
    }
    *pbVar3 = 0;
  }
  if (name_00 == (byte *)0x0) {
    wVar10 = L'\x02';
  }
  else {
    if (base64_decode_decode_table[0x42] != '\x01') {
      base64_decode_decode_table._112_4_ = 0xffffffff;
      base64_decode_decode_table._116_4_ = 0xffffffff;
      base64_decode_decode_table._120_4_ = 0xffffffff;
      base64_decode_decode_table._124_4_ = 0xffffffff;
      base64_decode_decode_table._96_4_ = 0xffffffff;
      base64_decode_decode_table._100_4_ = 0xffffffff;
      base64_decode_decode_table._104_4_ = 0xffffffff;
      base64_decode_decode_table._108_4_ = 0xffffffff;
      base64_decode_decode_table._80_4_ = 0xffffffff;
      base64_decode_decode_table._84_4_ = 0xffffffff;
      base64_decode_decode_table._88_4_ = 0xffffffff;
      base64_decode_decode_table._92_4_ = 0xffffffff;
      base64_decode_decode_table._64_4_ = 0xffffffff;
      base64_decode_decode_table._68_4_ = 0xffffffff;
      base64_decode_decode_table._72_4_ = 0xffffffff;
      base64_decode_decode_table._76_4_ = 0xffffffff;
      base64_decode_decode_table._48_4_ = 0xffffffff;
      base64_decode_decode_table._52_4_ = 0xffffffff;
      base64_decode_decode_table._56_4_ = 0xffffffff;
      base64_decode_decode_table._60_4_ = 0xffffffff;
      base64_decode_decode_table._32_4_ = 0xffffffff;
      base64_decode_decode_table._36_4_ = 0xffffffff;
      base64_decode_decode_table._40_4_ = 0xffffffff;
      base64_decode_decode_table._44_4_ = 0xffffffff;
      base64_decode_decode_table._16_4_ = 0xffffffff;
      base64_decode_decode_table._20_4_ = 0xffffffff;
      base64_decode_decode_table._24_4_ = 0xffffffff;
      base64_decode_decode_table._28_4_ = 0xffffffff;
      base64_decode_decode_table._0_4_ = 0xffffffff;
      base64_decode_decode_table._4_4_ = 0xffffffff;
      base64_decode_decode_table._8_4_ = 0xffffffff;
      base64_decode_decode_table._12_4_ = 0xffffffff;
      lVar4 = 0;
      do {
        base64_decode_decode_table[(byte)(&base64_decode_digits)[lVar4]] = (char)lVar4;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x40);
    }
    pbVar3 = (byte *)malloc((value_length - (value_length >> 2)) + 1);
    if (pbVar3 == (byte *)0x0) {
      size = 0;
      pbVar3 = (byte *)0x0;
    }
    else {
      pbVar5 = pbVar3;
      if (value_length != 0) {
        do {
          bVar11 = true;
          uVar8 = 0;
          pbVar2 = (byte *)value;
          uVar7 = 0;
          do {
            while( true ) {
              value = (char *)pbVar2;
              value_length = value_length - 1;
              bVar1 = *value;
              if ((bVar1 == 0x3d) || (bVar1 == 0x5f)) {
                value_length = 0;
                goto LAB_0014d343;
              }
              if (('\x1f' < (char)bVar1) && ((byte)base64_decode_decode_table[bVar1] != 0xff))
              break;
              value = (char *)((byte *)value + 1);
              pbVar2 = (byte *)value;
              if (!(bool)(value_length != 0 & bVar11)) goto LAB_0014d343;
            }
            uVar8 = uVar8 << 6 | (uint)(byte)base64_decode_decode_table[bVar1];
            uVar9 = uVar7 + 1;
            bVar11 = uVar7 < 3;
            uVar7 = uVar9;
          } while ((bVar11) && (pbVar2 = (byte *)value + 1, value_length != 0));
          value = (char *)((byte *)value + 1);
LAB_0014d343:
          iVar6 = uVar8 << (('\x04' - (char)uVar7) * '\x06' & 0x1fU);
          if (uVar7 == 2) {
LAB_0014d367:
            *pbVar5 = (byte)((uint)iVar6 >> 0x10);
          }
          else {
            if (uVar7 == 3) {
LAB_0014d364:
              pbVar5[1] = (byte)((uint)iVar6 >> 8);
              goto LAB_0014d367;
            }
            if (uVar7 == 4) {
              pbVar5[2] = (byte)iVar6;
              goto LAB_0014d364;
            }
          }
          iVar6 = uVar7 * 3 + 3;
          if (-1 < (int)(uVar7 * 3)) {
            iVar6 = uVar7 * 3;
          }
          pbVar5 = pbVar5 + (iVar6 >> 2);
        } while (value_length != 0);
      }
      size = (long)pbVar5 - (long)pbVar3;
    }
    if (pbVar3 != (byte *)0x0) {
      archive_entry_xattr_add_entry(entry,(char *)name_00,pbVar3,size);
      free(name_00);
      name_00 = pbVar3;
    }
    wVar10 = (wchar_t)(pbVar3 == (byte *)0x0);
    free(name_00);
  }
  return wVar10;
}

Assistant:

static int
pax_attribute_LIBARCHIVE_xattr(struct archive_entry *entry,
	const char *name, size_t name_length, const char *value, size_t value_length)
{
	char *name_decoded;
	void *value_decoded;
	size_t value_len;

	if (name_length < 1)
		return 3;

	/* URL-decode name */
	name_decoded = url_decode(name, name_length);
	if (name_decoded == NULL)
		return 2;

	/* Base-64 decode value */
	value_decoded = base64_decode(value, value_length, &value_len);
	if (value_decoded == NULL) {
		free(name_decoded);
		return 1;
	}

	archive_entry_xattr_add_entry(entry, name_decoded,
		value_decoded, value_len);

	free(name_decoded);
	free(value_decoded);
	return 0;
}